

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall embree::ImageT<embree::Col4<float>_>::~ImageT(ImageT<embree::Col4<float>_> *this)

{
  ImageT<embree::Col4<float>_> *in_RDI;
  
  ~ImageT(in_RDI);
  ::operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~ImageT() {
      delete[] data; data = nullptr;
    }